

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Response_NACK_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  byte *pbVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_220;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Minefield_Response_NACK_PDU *local_18;
  Minefield_Response_NACK_PDU *this_local;
  
  local_18 = this;
  this_local = (Minefield_Response_NACK_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Minefield Response NACK PDU-\n");
  Minefield_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_Minefield_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Requesting Entity ID.: ");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_((KString *)&citr,&this->m_ReqID);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"Request ID: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8ReqID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Missing PDU\'s: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumMisPdus);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"Missing PDU Sequence Numbers:\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_vSeqNums);
  local_220._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->m_vSeqNums);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_220);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"\t");
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&citrEnd);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)*pbVar3);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Response_NACK_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield Response NACK PDU-\n"
       << Minefield_Header::GetAsString()
       << "Requesting Entity ID.: " << m_ReqID.GetAsString()
       << "Request ID: "            << ( KUINT16 )m_ui8ReqID        << "\n"
       << "Number Missing PDU's: "  << ( KUINT16 )m_ui8NumMisPdus   << "\n"
       << "Missing PDU Sequence Numbers:\n";

    vector<KUINT8>::const_iterator citr = m_vSeqNums.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vSeqNums.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << "\t" << ( KUINT16 )*citr << "\n";
    }

    return ss.str();
}